

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O1

void vkt::ssbo::anon_unknown_15::generateCompareSrc
               (ostream *src,char *resultVar,BufferLayout *bufferLayout,BufferBlock *block,
               int instanceNdx,BlockDataPtr *blockPtr,BufferVar *bufVar,SubTypeAccess *accessPath,
               MatrixLoadFlags matrixLoadFlag)

{
  bool bVar1;
  VarTypeComponent VVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  BufferVarLayoutEntry *varLayout;
  char *__s;
  void *valuePtr;
  ostream *poVar6;
  size_t sVar7;
  int precision;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar8;
  int iVar9;
  undefined4 in_register_00000084;
  __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
  end;
  __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
  accessPath_00;
  BlockDataPtr *accessPath_01;
  int iVar10;
  undefined4 uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  BufferVar *var;
  MatrixLoadFlags matrixLoadFlag_00;
  BufferBlock *block_00;
  int local_100;
  int local_fc;
  int local_dc;
  undefined1 local_d8 [56];
  long local_a0;
  long local_98 [2];
  string shaderName;
  VarType curType;
  string apiName;
  
  end._M_current._4_4_ = in_register_00000084;
  end._M_current._0_4_ = instanceNdx;
  block_00 = (BufferBlock *)((ulong)block & 0xffffffff);
  accessPath_00._M_current = end._M_current;
  accessPath_01 = blockPtr;
  glu::
  getVarType<__gnu_cxx::__normal_iterator<glu::VarTypeComponent_const*,std::vector<glu::VarTypeComponent,std::allocator<glu::VarTypeComponent>>>>
            (&curType,(glu *)bufVar,*(VarType **)((long)&(bufVar->m_name).field_2 + 8),
             *(VarTypeComponent **)&bufVar->m_type,end);
  matrixLoadFlag_00 = (MatrixLoadFlags)block;
  if (curType.m_type == TYPE_STRUCT) {
    iVar9 = (int)((ulong)(*(long *)(CONCAT44(curType.m_data.basic.precision,
                                             curType.m_data.basic.type) + 0x28) -
                         *(long *)(CONCAT44(curType.m_data.basic.precision,curType.m_data.basic.type
                                           ) + 0x20)) >> 3) * -0x49249249;
    if (0 < iVar9) {
      iVar3 = 0;
      do {
        glu::SubTypeAccess::member((SubTypeAccess *)local_d8,(SubTypeAccess *)bufVar,iVar3);
        generateCompareSrc(src,resultVar,bufferLayout,block_00,instanceNdx,blockPtr,
                           (BufferVar *)local_d8,(SubTypeAccess *)0x0,matrixLoadFlag_00);
        if ((void *)local_d8._24_8_ != (void *)0x0) {
          operator_delete((void *)local_d8._24_8_,local_d8._40_8_ - local_d8._24_8_);
        }
        glu::VarType::~VarType((VarType *)local_d8);
        iVar3 = iVar3 + 1;
      } while (iVar9 != iVar3);
    }
    goto LAB_006bad2f;
  }
  if (curType.m_type == TYPE_ARRAY) {
    uVar11 = curType.m_data.array.size;
    if (curType.m_data.array.size == -1) {
      uVar11 = *(int *)((long)&((bufferLayout[2].blocks.
                                 super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus +
                       (long)(int)matrixLoadFlag_00 * 4);
    }
    if (0 < (int)uVar11) {
      iVar9 = 0;
      do {
        glu::SubTypeAccess::element((SubTypeAccess *)local_d8,(SubTypeAccess *)bufVar,iVar9);
        generateCompareSrc(src,resultVar,bufferLayout,block_00,instanceNdx,blockPtr,
                           (BufferVar *)local_d8,(SubTypeAccess *)0x0,matrixLoadFlag_00);
        if ((void *)local_d8._24_8_ != (void *)0x0) {
          operator_delete((void *)local_d8._24_8_,local_d8._40_8_ - local_d8._24_8_);
        }
        glu::VarType::~VarType((VarType *)local_d8);
        iVar9 = iVar9 + 1;
      } while (uVar11 != iVar9);
    }
    goto LAB_006bad2f;
  }
  var = (BufferVar *)(&(bufVar->m_name).field_2._M_allocated_capacity + 1);
  ssbo::(anonymous_namespace)::getAPIName_abi_cxx11_
            (&apiName,(_anonymous_namespace_ *)bufferLayout,(BufferBlock *)blockPtr,var,
             (TypeComponentVector *)accessPath_00._M_current);
  iVar9 = BufferLayout::getVariableIndex((BufferLayout *)resultVar,&apiName);
  varLayout = (BufferVarLayoutEntry *)((long)iVar9 * 0x48 + *(long *)(resultVar + 0x18));
  ssbo::(anonymous_namespace)::getShaderName_abi_cxx11_
            (&shaderName,(_anonymous_namespace_ *)bufferLayout,block_00,(int)blockPtr,var,
             (TypeComponentVector *)accessPath_01);
  __s = glu::getDataTypeName(curType.m_data.basic.type);
  VVar2 = *end._M_current;
  iVar9 = computeOffset(varLayout,(TypeComponentVector *)var);
  valuePtr = (void *)((long)iVar9 + (long)VVar2);
  if (curType.m_data.basic.type - TYPE_FLOAT_MAT2 < 9 ||
      curType.m_data.basic.type - TYPE_DOUBLE_MAT2 < 9) {
    if ((int)accessPath != 1) {
      std::__ostream_insert<char,std::char_traits<char>>(src,"\t",1);
      std::__ostream_insert<char,std::char_traits<char>>(src,"allOk",5);
      std::__ostream_insert<char,std::char_traits<char>>(src," = ",3);
      std::__ostream_insert<char,std::char_traits<char>>(src,"allOk",5);
      std::__ostream_insert<char,std::char_traits<char>>(src," && compare_",0xc);
      if (__s == (char *)0x0) {
        std::ios::clear((int)src + (int)*(undefined8 *)(*(long *)src + -0x18));
      }
      else {
        sVar7 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(src,__s,sVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>(src,"(",1);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (src,shaderName._M_dataplus._M_p,shaderName._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
      generateImmMatrixSrc
                (src,curType.m_data.basic.type,varLayout->matrixStride,varLayout->isRowMajor,
                 valuePtr);
      goto LAB_006bacd9;
    }
    iVar9 = varLayout->matrixStride;
    bVar1 = varLayout->isRowMajor;
    local_d8._48_8_ = local_98;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_d8 + 0x30),shaderName._M_dataplus._M_p,
               shaderName._M_dataplus._M_p + shaderName._M_string_length);
    iVar3 = glu::getDataTypeMatrixNumRows(curType.m_data.basic.type);
    iVar4 = glu::getDataTypeMatrixNumColumns(curType.m_data.basic.type);
    if (0 < iVar4) {
      local_fc = 0;
      local_100 = 0;
      iVar13 = 0;
      do {
        if (0 < iVar3) {
          iVar10 = 0;
          iVar14 = local_fc;
          iVar12 = local_100;
          do {
            std::__ostream_insert<char,std::char_traits<char>>(src,"\t",1);
            std::__ostream_insert<char,std::char_traits<char>>(src,"allOk",5);
            std::__ostream_insert<char,std::char_traits<char>>(src," = ",3);
            std::__ostream_insert<char,std::char_traits<char>>(src,"allOk",5);
            std::__ostream_insert<char,std::char_traits<char>>(src," && compare_",0xc);
            std::__ostream_insert<char,std::char_traits<char>>(src,"float",5);
            std::__ostream_insert<char,std::char_traits<char>>(src,"(",1);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (src,(char *)local_d8._48_8_,local_a0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"[",1);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar13);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"][",2);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"], ",3);
            iVar5 = iVar12;
            if (bVar1 != false) {
              iVar5 = iVar14;
            }
            de::floatToString_abi_cxx11_
                      ((string *)local_d8,(de *)&DAT_00000001,
                       *(float *)((long)valuePtr + (long)iVar5),precision);
            std::__ostream_insert<char,std::char_traits<char>>
                      (src,(char *)local_d8._0_8_,local_d8._8_8_);
            if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
              operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
            }
            std::__ostream_insert<char,std::char_traits<char>>(src,");\n",3);
            iVar10 = iVar10 + 1;
            iVar12 = iVar12 + 4;
            iVar14 = iVar14 + iVar9;
          } while (iVar3 != iVar10);
        }
        iVar13 = iVar13 + 1;
        local_100 = local_100 + iVar9;
        local_fc = local_fc + 4;
      } while (iVar13 != iVar4);
      if (0 < iVar4) {
        local_dc = 0;
        local_fc = 0;
        local_100 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(src,"\t",1);
          std::__ostream_insert<char,std::char_traits<char>>(src,"allOk",5);
          std::__ostream_insert<char,std::char_traits<char>>(src," = ",3);
          std::__ostream_insert<char,std::char_traits<char>>(src,"allOk",5);
          std::__ostream_insert<char,std::char_traits<char>>(src," && compare_",0xc);
          std::__ostream_insert<char,std::char_traits<char>>(src,"vec",3);
          poVar6 = (ostream *)std::ostream::operator<<(src,iVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(",1);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,(char *)local_d8._48_8_,local_a0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"[",1);
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_100);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"], ",3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"vec",3);
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(",1);
          if (0 < iVar3) {
            iVar12 = 0;
            uVar8 = extraout_RDX;
            iVar13 = local_dc;
            iVar14 = local_fc;
            do {
              iVar10 = iVar14;
              if (bVar1 != false) {
                iVar10 = iVar13;
              }
              de::floatToString_abi_cxx11_
                        ((string *)local_d8,(de *)&DAT_00000001,
                         *(float *)((long)valuePtr + (long)iVar10),(int)uVar8);
              std::__ostream_insert<char,std::char_traits<char>>
                        (src,(char *)local_d8._0_8_,local_d8._8_8_);
              uVar8 = extraout_RDX_00;
              if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
                operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
                uVar8 = extraout_RDX_01;
              }
              if (iVar12 < iVar3 + -1) {
                std::__ostream_insert<char,std::char_traits<char>>(src,", ",2);
                uVar8 = extraout_RDX_02;
              }
              iVar12 = iVar12 + 1;
              iVar14 = iVar14 + 4;
              iVar13 = iVar13 + iVar9;
            } while (iVar3 != iVar12);
          }
          std::__ostream_insert<char,std::char_traits<char>>(src,"));\n",4);
          local_100 = local_100 + 1;
          local_fc = local_fc + iVar9;
          local_dc = local_dc + 4;
        } while (local_100 != iVar4);
      }
    }
    if ((long *)local_d8._48_8_ != local_98) {
      operator_delete((void *)local_d8._48_8_,local_98[0] + 1);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(src,"\t",1);
    std::__ostream_insert<char,std::char_traits<char>>(src,"allOk",5);
    std::__ostream_insert<char,std::char_traits<char>>(src," = ",3);
    std::__ostream_insert<char,std::char_traits<char>>(src,"allOk",5);
    std::__ostream_insert<char,std::char_traits<char>>(src," && compare_",0xc);
    if (__s == (char *)0x0) {
      std::ios::clear((int)src + (int)*(undefined8 *)(*(long *)src + -0x18));
    }
    else {
      sVar7 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(src,__s,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>(src,"(",1);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (src,shaderName._M_dataplus._M_p,shaderName._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    generateImmScalarVectorSrc(src,curType.m_data.basic.type,valuePtr);
LAB_006bacd9:
    std::__ostream_insert<char,std::char_traits<char>>(src,");\n",3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shaderName._M_dataplus._M_p != &shaderName.field_2) {
    operator_delete(shaderName._M_dataplus._M_p,shaderName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)apiName._M_dataplus._M_p != &apiName.field_2) {
    operator_delete(apiName._M_dataplus._M_p,apiName.field_2._M_allocated_capacity + 1);
  }
LAB_006bad2f:
  glu::VarType::~VarType(&curType);
  return;
}

Assistant:

void generateCompareSrc (
	std::ostream&				src,
	const char*					resultVar,
	const BufferLayout&			bufferLayout,
	const BufferBlock&			block,
	int							instanceNdx,
	const BlockDataPtr&			blockPtr,
	const BufferVar&			bufVar,
	const glu::SubTypeAccess&	accessPath,
	MatrixLoadFlags				matrixLoadFlag)
{
	const VarType curType = accessPath.getType();

	if (curType.isArrayType())
	{
		const int arraySize = curType.getArraySize() == VarType::UNSIZED_ARRAY ? block.getLastUnsizedArraySize(instanceNdx) : curType.getArraySize();

		for (int elemNdx = 0; elemNdx < arraySize; elemNdx++)
			generateCompareSrc(src, resultVar, bufferLayout, block, instanceNdx, blockPtr, bufVar, accessPath.element(elemNdx), LOAD_FULL_MATRIX);
	}
	else if (curType.isStructType())
	{
		const int numMembers = curType.getStructPtr()->getNumMembers();

		for (int memberNdx = 0; memberNdx < numMembers; memberNdx++)
			generateCompareSrc(src, resultVar, bufferLayout, block, instanceNdx, blockPtr, bufVar, accessPath.member(memberNdx), LOAD_FULL_MATRIX);
	}
	else
	{
		DE_ASSERT(curType.isBasicType());

		const string	apiName	= getAPIName(block, bufVar, accessPath.getPath());
		const int		varNdx	= bufferLayout.getVariableIndex(apiName);

		DE_ASSERT(varNdx >= 0);
		{
			const BufferVarLayoutEntry&	varLayout		= bufferLayout.bufferVars[varNdx];
			const string				shaderName		= getShaderName(block, instanceNdx, bufVar, accessPath.getPath());
			const glu::DataType			basicType		= curType.getBasicType();
			const bool					isMatrix		= glu::isDataTypeMatrix(basicType);
			const char*					typeName		= glu::getDataTypeName(basicType);
			const void*					valuePtr		= (const deUint8*)blockPtr.ptr + computeOffset(varLayout, accessPath.getPath());


			if (isMatrix)
			{
				if (matrixLoadFlag == LOAD_MATRIX_COMPONENTS)
					generateImmMatrixSrc(src, basicType, varLayout.matrixStride, varLayout.isRowMajor, valuePtr, resultVar, typeName, shaderName);
				else
				{
					src << "\t" << resultVar << " = " << resultVar << " && compare_" << typeName << "(" << shaderName << ", ";
					generateImmMatrixSrc (src, basicType, varLayout.matrixStride, varLayout.isRowMajor, valuePtr);
					src << ");\n";
				}
			}
			else
			{
				src << "\t" << resultVar << " = " << resultVar << " && compare_" << typeName << "(" << shaderName << ", ";
				generateImmScalarVectorSrc(src, basicType, valuePtr);
				src << ");\n";
			}
		}
	}
}